

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrInteractionProfileDpadBindingEXT *value)

{
  NextChainResult NVar1;
  ValidateXrHandleResult VVar2;
  XrResult XVar3;
  XrStructureType XVar4;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *p_Var5;
  XrHapticPcmVibrationFB *pXVar6;
  XrActionSet_T *in_stack_fffffffffffffc98;
  allocator local_351;
  string local_350;
  allocator local_329;
  string local_328;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_2c8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_2b0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_298;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_280;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_268;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_250;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_238;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_220;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  string error_message;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  
  XVar3 = XR_SUCCESS;
  if (value->type != XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrInteractionProfileDpadBindingEXT",
               value->type,"VUID-XrInteractionProfileDpadBindingEXT-type-type",
               XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT,
               "XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT");
  }
  if (check_pnext) {
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    NVar1 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs
                              ,&encountered_structs,&duplicate_ext_structs);
    if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)&local_350);
      std::__cxx11::string::append((char *)&error_message);
      StructTypesToString_abi_cxx11_(&local_350,instance_info,&duplicate_ext_structs);
      std::__cxx11::string::append((string *)&error_message);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::string
                ((string *)&local_350,"VUID-XrInteractionProfileDpadBindingEXT-next-unique",
                 &local_351);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1f0,objects_info);
      std::__cxx11::string::string
                ((string *)&local_328,
                 "Multiple structures of the same type(s) in \"next\" chain for XrInteractionProfileDpadBindingEXT struct"
                 ,&local_329);
      CoreValidLogMessage(instance_info,&local_350,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1f0,&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_1f0);
      std::__cxx11::string::~string((string *)&local_350);
LAB_001589b9:
      std::__cxx11::string::~string((string *)&error_message);
      XVar3 = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrInteractionProfileDpadBindingEXT-next-next",
                 (allocator *)&local_328);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1d8,objects_info);
      std::__cxx11::string::string
                ((string *)&local_350,
                 "Invalid structure(s) in \"next\" chain for XrInteractionProfileDpadBindingEXT struct \"next\""
                 ,&local_351);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                          ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&local_1d8,&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_1d8);
      goto LAB_001589b9;
    }
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  }
  if (!check_members || XVar3 != XR_SUCCESS) {
    return XVar3;
  }
  VVar2 = VerifyXrActionSetHandle(&value->actionSet);
  if (VVar2 != VALIDATE_XR_HANDLE_SUCCESS) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,"Invalid XrActionSet handle \"actionSet\" ");
    HandleToHexString<XrActionSet_T*>(in_stack_fffffffffffffc98);
    std::operator<<((ostream *)&error_message,(string *)&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::string
              ((string *)&local_350,"VUID-XrInteractionProfileDpadBindingEXT-actionSet-parameter",
               (allocator *)&valid_ext_structs);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_208,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&local_350,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_208,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_208);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
    return XR_ERROR_HANDLE_INVALID;
  }
  pXVar6 = (XrHapticPcmVibrationFB *)value->onHaptic;
  if (pXVar6 == (XrHapticPcmVibrationFB *)0x0) {
LAB_00158dcb:
    pXVar6 = (XrHapticPcmVibrationFB *)value->offHaptic;
    if (pXVar6 == (XrHapticPcmVibrationFB *)0x0) {
      return XR_SUCCESS;
    }
    XVar4 = pXVar6->type;
    if (XVar4 == XR_TYPE_HAPTIC_VIBRATION) {
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,false,true,
                               (XrHapticVibration *)pXVar6);
      if (XVar3 != XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "Structure XrInteractionProfileDpadBindingEXT member offHaptic",
                   (allocator *)&local_350);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::string
                  ((string *)&local_350,
                   "VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",
                   (allocator *)&local_328);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_280,objects_info);
        CoreValidLogMessage(instance_info,&local_350,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_280,&error_message);
        p_Var5 = &local_280;
        goto LAB_00159003;
      }
      pXVar6 = (XrHapticPcmVibrationFB *)value->offHaptic;
      if (pXVar6 == (XrHapticPcmVibrationFB *)0x0) {
        return XR_SUCCESS;
      }
      XVar4 = pXVar6->type;
    }
    if (XVar4 == XR_TYPE_HAPTIC_AMPLITUDE_ENVELOPE_VIBRATION_FB) {
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                               (XrHapticAmplitudeEnvelopeVibrationFB *)pXVar6);
      if (XVar3 != XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "Structure XrInteractionProfileDpadBindingEXT member offHaptic",
                   (allocator *)&local_350);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::string
                  ((string *)&local_350,
                   "VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",
                   (allocator *)&local_328);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_298,objects_info);
        CoreValidLogMessage(instance_info,&local_350,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_298,&error_message);
        p_Var5 = &local_298;
        goto LAB_00159003;
      }
      pXVar6 = (XrHapticPcmVibrationFB *)value->offHaptic;
      if (pXVar6 == (XrHapticPcmVibrationFB *)0x0) {
        return XR_SUCCESS;
      }
    }
    if (pXVar6->type == XR_TYPE_HAPTIC_PCM_VIBRATION_FB) {
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,pXVar6);
      if (XVar3 != XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "Structure XrInteractionProfileDpadBindingEXT member offHaptic",
                   (allocator *)&local_350);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::string
                  ((string *)&local_350,
                   "VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",
                   (allocator *)&local_328);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_2b0,objects_info);
        CoreValidLogMessage(instance_info,&local_350,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_2b0,&error_message);
        p_Var5 = &local_2b0;
        goto LAB_00159003;
      }
      pXVar6 = (XrHapticPcmVibrationFB *)value->offHaptic;
      if (pXVar6 == (XrHapticPcmVibrationFB *)0x0) {
        return XR_SUCCESS;
      }
    }
    XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,true,false,
                             (XrHapticBaseHeader *)pXVar6);
    if (XVar3 == XR_SUCCESS) {
      return XR_SUCCESS;
    }
    std::__cxx11::string::string
              ((string *)&error_message,
               "VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",(allocator *)&local_328
              );
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_2c8,objects_info);
    std::__cxx11::string::string
              ((string *)&local_350,
               "Structure XrInteractionProfileDpadBindingEXT member offHaptic is invalid",
               (allocator *)&valid_ext_structs);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_2c8,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    p_Var5 = &local_2c8;
  }
  else {
    XVar4 = pXVar6->type;
    if (XVar4 == XR_TYPE_HAPTIC_VIBRATION) {
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,false,true,
                               (XrHapticVibration *)pXVar6);
      if (XVar3 == XR_SUCCESS) {
        pXVar6 = (XrHapticPcmVibrationFB *)value->onHaptic;
        if (pXVar6 == (XrHapticPcmVibrationFB *)0x0) goto LAB_00158dcb;
        XVar4 = pXVar6->type;
        goto LAB_00158bbc;
      }
      std::__cxx11::string::string
                ((string *)&error_message,
                 "Structure XrInteractionProfileDpadBindingEXT member onHaptic",
                 (allocator *)&local_350);
      std::__cxx11::string::append((char *)&error_message);
      std::__cxx11::string::string
                ((string *)&local_350,"VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter",
                 (allocator *)&local_328);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_220,objects_info);
      CoreValidLogMessage(instance_info,&local_350,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_220,&error_message);
      p_Var5 = &local_220;
LAB_00159003:
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(p_Var5);
      std::__cxx11::string::~string((string *)&local_350);
      goto LAB_00159012;
    }
LAB_00158bbc:
    if (XVar4 == XR_TYPE_HAPTIC_AMPLITUDE_ENVELOPE_VIBRATION_FB) {
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                               (XrHapticAmplitudeEnvelopeVibrationFB *)pXVar6);
      if (XVar3 != XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "Structure XrInteractionProfileDpadBindingEXT member onHaptic",
                   (allocator *)&local_350);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::string
                  ((string *)&local_350,"VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter"
                   ,(allocator *)&local_328);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_238,objects_info);
        CoreValidLogMessage(instance_info,&local_350,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_238,&error_message);
        p_Var5 = &local_238;
        goto LAB_00159003;
      }
      pXVar6 = (XrHapticPcmVibrationFB *)value->onHaptic;
      if (pXVar6 == (XrHapticPcmVibrationFB *)0x0) goto LAB_00158dcb;
    }
    if (pXVar6->type == XR_TYPE_HAPTIC_PCM_VIBRATION_FB) {
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,pXVar6);
      if (XVar3 != XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "Structure XrInteractionProfileDpadBindingEXT member onHaptic",
                   (allocator *)&local_350);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::string
                  ((string *)&local_350,"VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter"
                   ,(allocator *)&local_328);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_250,objects_info);
        CoreValidLogMessage(instance_info,&local_350,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_250,&error_message);
        p_Var5 = &local_250;
        goto LAB_00159003;
      }
      pXVar6 = (XrHapticPcmVibrationFB *)value->onHaptic;
      if (pXVar6 == (XrHapticPcmVibrationFB *)0x0) goto LAB_00158dcb;
    }
    XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,true,false,
                             (XrHapticBaseHeader *)pXVar6);
    if (XVar3 == XR_SUCCESS) goto LAB_00158dcb;
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter"
               ,(allocator *)&local_328);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_268,objects_info);
    std::__cxx11::string::string
              ((string *)&local_350,
               "Structure XrInteractionProfileDpadBindingEXT member onHaptic is invalid",
               (allocator *)&valid_ext_structs);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_268,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    p_Var5 = &local_268;
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(p_Var5);
LAB_00159012:
  std::__cxx11::string::~string((string *)&error_message);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrInteractionProfileDpadBindingEXT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrInteractionProfileDpadBindingEXT",
                             value->type, "VUID-XrInteractionProfileDpadBindingEXT-type-type", XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT, "XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrInteractionProfileDpadBindingEXT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrInteractionProfileDpadBindingEXT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrInteractionProfileDpadBindingEXT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    {
        // writeValidateInlineHandleValidation
        ValidateXrHandleResult handle_result = VerifyXrActionSetHandle(&value->actionSet);
        if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
            // Not a valid handle or NULL (which is not valid in this case)
            std::ostringstream oss;
            oss << "Invalid XrActionSet handle \"actionSet\" ";
            oss << HandleToHexString(value->actionSet);
            CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-actionSet-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, oss.str());
            return XR_ERROR_HANDLE_INVALID;
        }
    }
    // Validate if XrHapticBaseHeader is a child structure of type XrHapticVibration and it is valid
    {
        if (value->onHaptic != nullptr) {
            const XrHapticVibration* new_hapticvibration_value = reinterpret_cast<const XrHapticVibration*>(value->onHaptic);
            if (new_hapticvibration_value->type == XR_TYPE_HAPTIC_VIBRATION) {
                if (nullptr != new_hapticvibration_value) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_hapticvibration_value);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrInteractionProfileDpadBindingEXT member onHaptic";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        }
                    }
            }
        }
    }
    // Validate if XrHapticBaseHeader is a child structure of type XrHapticAmplitudeEnvelopeVibrationFB and it is valid
    {
        if (value->onHaptic != nullptr) {
            const XrHapticAmplitudeEnvelopeVibrationFB* new_hapticamplitudeenvelopevibrationfb_value = reinterpret_cast<const XrHapticAmplitudeEnvelopeVibrationFB*>(value->onHaptic);
            if (new_hapticamplitudeenvelopevibrationfb_value->type == XR_TYPE_HAPTIC_AMPLITUDE_ENVELOPE_VIBRATION_FB) {
                if (nullptr != new_hapticamplitudeenvelopevibrationfb_value) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_hapticamplitudeenvelopevibrationfb_value);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrInteractionProfileDpadBindingEXT member onHaptic";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        }
                    }
            }
        }
    }
    // Validate if XrHapticBaseHeader is a child structure of type XrHapticPcmVibrationFB and it is valid
    {
        if (value->onHaptic != nullptr) {
            const XrHapticPcmVibrationFB* new_hapticpcmvibrationfb_value = reinterpret_cast<const XrHapticPcmVibrationFB*>(value->onHaptic);
            if (new_hapticpcmvibrationfb_value->type == XR_TYPE_HAPTIC_PCM_VIBRATION_FB) {
                if (nullptr != new_hapticpcmvibrationfb_value) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_hapticpcmvibrationfb_value);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrInteractionProfileDpadBindingEXT member onHaptic";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        }
                    }
            }
        }
    }
    // Validate that the base-structure XrHapticBaseHeader is valid
    if (nullptr != value->onHaptic) {
        xr_result = ValidateXrStruct(instance_info, command_name,
                                                        objects_info, check_members, true, value->onHaptic);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
                                "Structure XrInteractionProfileDpadBindingEXT member onHaptic is invalid");
            return xr_result;
        }
    }
    // Validate if XrHapticBaseHeader is a child structure of type XrHapticVibration and it is valid
    {
        if (value->offHaptic != nullptr) {
            const XrHapticVibration* new_hapticvibration_value = reinterpret_cast<const XrHapticVibration*>(value->offHaptic);
            if (new_hapticvibration_value->type == XR_TYPE_HAPTIC_VIBRATION) {
                if (nullptr != new_hapticvibration_value) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_hapticvibration_value);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrInteractionProfileDpadBindingEXT member offHaptic";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        }
                    }
            }
        }
    }
    // Validate if XrHapticBaseHeader is a child structure of type XrHapticAmplitudeEnvelopeVibrationFB and it is valid
    {
        if (value->offHaptic != nullptr) {
            const XrHapticAmplitudeEnvelopeVibrationFB* new_hapticamplitudeenvelopevibrationfb_value = reinterpret_cast<const XrHapticAmplitudeEnvelopeVibrationFB*>(value->offHaptic);
            if (new_hapticamplitudeenvelopevibrationfb_value->type == XR_TYPE_HAPTIC_AMPLITUDE_ENVELOPE_VIBRATION_FB) {
                if (nullptr != new_hapticamplitudeenvelopevibrationfb_value) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_hapticamplitudeenvelopevibrationfb_value);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrInteractionProfileDpadBindingEXT member offHaptic";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        }
                    }
            }
        }
    }
    // Validate if XrHapticBaseHeader is a child structure of type XrHapticPcmVibrationFB and it is valid
    {
        if (value->offHaptic != nullptr) {
            const XrHapticPcmVibrationFB* new_hapticpcmvibrationfb_value = reinterpret_cast<const XrHapticPcmVibrationFB*>(value->offHaptic);
            if (new_hapticpcmvibrationfb_value->type == XR_TYPE_HAPTIC_PCM_VIBRATION_FB) {
                if (nullptr != new_hapticpcmvibrationfb_value) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_hapticpcmvibrationfb_value);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrInteractionProfileDpadBindingEXT member offHaptic";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        }
                    }
            }
        }
    }
    // Validate that the base-structure XrHapticBaseHeader is valid
    if (nullptr != value->offHaptic) {
        xr_result = ValidateXrStruct(instance_info, command_name,
                                                        objects_info, check_members, true, value->offHaptic);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
                                "Structure XrInteractionProfileDpadBindingEXT member offHaptic is invalid");
            return xr_result;
        }
    }
    // Everything checked out properly
    return xr_result;
}